

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

bool __thiscall ParamEntry::contains(ParamEntry *this,ParamEntry *op2)

{
  ParamEntry *op2_local;
  ParamEntry *this_local;
  
  if ((this->type == TYPE_UNKNOWN) || (op2->type == this->type)) {
    if (this->spaceid == op2->spaceid) {
      if (op2->addressbase < this->addressbase) {
        this_local._7_1_ = false;
      }
      else if ((this->addressbase + (long)this->size) - 1 < (op2->addressbase + (long)op2->size) - 1
              ) {
        this_local._7_1_ = false;
      }
      else if (this->alignment == op2->alignment) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ParamEntry::contains(const ParamEntry &op2) const

{
  if ((type!=TYPE_UNKNOWN)&&(op2.type != type)) return false;
  if (spaceid != op2.spaceid) return false;
  if (op2.addressbase < addressbase) return false;
  if ((op2.addressbase+op2.size-1) > (addressbase+size-1)) return false;
  if (alignment != op2.alignment) return false;
  return true;
}